

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O0

plutovg_font_face_t *
plutovg_font_face_load_from_data
          (void *data,uint length,int ttcindex,plutovg_destroy_func_t destroy_func,void *closure)

{
  int iVar1;
  plutovg_font_face_t *ppVar2;
  plutovg_font_face_t *face;
  undefined1 local_d0 [4];
  int offset;
  stbtt_fontinfo info;
  void *closure_local;
  plutovg_destroy_func_t destroy_func_local;
  int ttcindex_local;
  uint length_local;
  void *data_local;
  
  info.fdselect._8_8_ = closure;
  iVar1 = stbtt_GetFontOffsetForIndex((uchar *)data,ttcindex);
  if ((iVar1 != -1) &&
     (iVar1 = stbtt_InitFont((stbtt_fontinfo *)local_d0,(uchar *)data,iVar1), iVar1 != 0)) {
    ppVar2 = (plutovg_font_face_t *)malloc(0x8d0);
    ppVar2->ref_count = 1;
    memcpy(&ppVar2->info,local_d0,0xa0);
    stbtt_GetFontVMetrics(&ppVar2->info,&ppVar2->ascent,&ppVar2->descent,&ppVar2->line_gap);
    stbtt_GetFontBoundingBox(&ppVar2->info,&ppVar2->x1,&ppVar2->y1,&ppVar2->x2,&ppVar2->y2);
    memset(ppVar2->glyphs,0,0x800);
    ppVar2->destroy_func = destroy_func;
    ppVar2->closure = (void *)info.fdselect._8_8_;
    return ppVar2;
  }
  if (destroy_func != (plutovg_destroy_func_t)0x0) {
    (*destroy_func)((void *)info.fdselect._8_8_);
  }
  return (plutovg_font_face_t *)0x0;
}

Assistant:

plutovg_font_face_t* plutovg_font_face_load_from_data(const void* data, unsigned int length, int ttcindex, plutovg_destroy_func_t destroy_func, void* closure)
{
    stbtt_fontinfo info;
    int offset = stbtt_GetFontOffsetForIndex(data, ttcindex);
    if(offset == -1 || !stbtt_InitFont(&info, data, offset)) {
        if(destroy_func)
            destroy_func(closure);
        return NULL;
    }

    plutovg_font_face_t* face = malloc(sizeof(plutovg_font_face_t));
    face->ref_count = 1;
    face->info = info;
    stbtt_GetFontVMetrics(&face->info, &face->ascent, &face->descent, &face->line_gap);
    stbtt_GetFontBoundingBox(&face->info, &face->x1, &face->y1, &face->x2, &face->y2);
    memset(face->glyphs, 0, sizeof(face->glyphs));
    face->destroy_func = destroy_func;
    face->closure = closure;
    return face;
}